

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Areal_Object_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Areal_Object_State_PDU *this)

{
  pointer pWVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pWVar3;
  KStringStream ss;
  KString local_2b8;
  KString local_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_2b8,(Header7 *)this);
  poVar2 = std::operator<<(local_1a8,(string *)&local_2b8);
  poVar2 = std::operator<<(poVar2,"-Areal Object State PDU-\n");
  Object_State_Header::GetAsString_abi_cxx11_(&local_1d8,&this->super_Object_State_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"Modification:\n");
  poVar2 = std::operator<<(poVar2,"\tLocation: ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(byte)(this->super_Object_State_Header).field_0x4b & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Object Type: ");
  DATA_TYPE::ObjectType::GetAsString_abi_cxx11_(&local_1f8,&this->m_ObjTyp);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  DATA_TYPE::ArealObjectAppearance::GetAsString_abi_cxx11_(&local_218,&this->m_Apperance);
  poVar2 = std::operator<<(poVar2,(string *)&local_218);
  poVar2 = std::operator<<(poVar2,"Number Of Points: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumPoints);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Requestor ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_258,&this->m_ReqID);
  UTILS::IndentString(&local_238,&local_258,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_238);
  poVar2 = std::operator<<(poVar2,"Receiving ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_298,&this->m_RecvID);
  UTILS::IndentString(&local_278,&local_298,Tabs_00,in_CL);
  std::operator<<(poVar2,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  pWVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pWVar3 = (this->m_vPoints).
                super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
                ._M_impl.super__Vector_impl_data._M_start; pWVar3 != pWVar1; pWVar3 = pWVar3 + 1) {
    poVar2 = std::operator<<(local_1a8,"Point Location: ");
    (*(pWVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2b8,pWVar3);
    std::operator<<(poVar2,(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Areal_Object_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Areal Object State PDU-\n"
       << Object_State_Header::GetAsString()
       << "Modification:\n"
       << "\tLocation: " << ( KUINT16 )m_ModificationUnion.m_ui8LocBit << "\n"
       << "Object Type: " << m_ObjTyp.GetAsString()
       << m_Apperance.GetAsString()
       << "Number Of Points: " << m_ui16NumPoints << "\n"
       << "Requestor ID:\n" << IndentString( m_ReqID.GetAsString(), 1 )
       << "Receiving ID:\n" << IndentString( m_RecvID.GetAsString(), 1 );

    vector<WorldCoordinates>::const_iterator citr = m_vPoints.begin();
    vector<WorldCoordinates>::const_iterator citrEnd = m_vPoints.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << "Point Location: " << citr->GetAsString();
    }

    return ss.str();
}